

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMemory.cpp
# Opt level: O2

void * __thiscall xercesc_4_0::XMemory::operator_new(XMemory *this,size_t size)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)
           (**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x18))
                     (XMLPlatformUtils::fgMemoryManager,this + 8);
  *puVar1 = XMLPlatformUtils::fgMemoryManager;
  return puVar1 + 1;
}

Assistant:

void* XMemory::operator new(size_t size)
{
	size_t headerSize = XMLPlatformUtils::alignPointerForNewBlockAllocation(
										sizeof(MemoryManager*));
	
    void* const block = XMLPlatformUtils::fgMemoryManager->allocate
        (
	        headerSize + size
        );
    *(MemoryManager**)block = XMLPlatformUtils::fgMemoryManager;

    return (char*)block + headerSize;
}